

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# param.h
# Opt level: O2

int __thiscall MeCab::Param::get<int>(Param *this,char *key)

{
  const_iterator cVar1;
  ostream *poVar2;
  long *plVar3;
  istream *piVar4;
  uint uVar5;
  stringstream interpreter;
  uint local_1bc;
  string local_1b8 [32];
  undefined1 local_198 [392];
  
  std::__cxx11::string::string((string *)local_198,key,(allocator *)&local_1bc);
  cVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&(this->conf_)._M_t,(key_type *)local_198);
  std::__cxx11::string::~string((string *)local_198);
  if ((_Rb_tree_header *)cVar1._M_node == &(this->conf_)._M_t._M_impl.super__Rb_tree_header) {
    uVar5 = 0;
  }
  else {
    std::__cxx11::string::string(local_1b8,(string *)(cVar1._M_node + 2));
    std::__cxx11::stringstream::stringstream((stringstream *)local_198);
    poVar2 = std::operator<<((ostream *)(local_198 + 0x10),local_1b8);
    uVar5 = 0;
    if (((byte)poVar2[*(long *)(*(long *)poVar2 + -0x18) + 0x20] & 5) == 0) {
      plVar3 = (long *)std::istream::operator>>((istream *)local_198,(int *)&local_1bc);
      uVar5 = 0;
      if ((*(byte *)((long)plVar3 + *(long *)(*plVar3 + -0x18) + 0x20) & 5) == 0) {
        piVar4 = std::ws<char,std::char_traits<char>>((istream *)local_198);
        uVar5 = (*(int *)(piVar4 + *(long *)(*(long *)piVar4 + -0x18) + 0x20) << 0x1e) >> 0x1f &
                local_1bc;
      }
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_198);
    std::__cxx11::string::~string(local_1b8);
  }
  return uVar5;
}

Assistant:

T get(const char *key) const {
    std::map<std::string, std::string>::const_iterator it = conf_.find(key);
    if (it == conf_.end()) {
      scoped_ptr<T> r(new T());
      return *r;
    }
    return lexical_cast<T, std::string>(it->second);
  }